

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_confuse_dir(player *p,int *dp,_Bool too)

{
  uint32_t uVar1;
  int local_28;
  wchar_t dir;
  _Bool too_local;
  int *dp_local;
  player *p_local;
  
  local_28 = *dp;
  if (p->timed[4] != 0) {
    if ((local_28 == 5) || (uVar1 = Rand_div(100), (int)uVar1 < 0x4b)) {
      uVar1 = Rand_div(8);
      local_28 = (int)ddd[(int)uVar1];
    }
    if (too) {
      msg("You are too confused.");
      return true;
    }
    if (*dp != local_28) {
      msg("You are confused.");
      *dp = local_28;
      return true;
    }
  }
  return false;
}

Assistant:

bool player_confuse_dir(struct player *p, int *dp, bool too)
{
	int dir = *dp;

	if (p->timed[TMD_CONFUSED]) {
		if ((dir == 5) || (randint0(100) < 75)) {
			/* Random direction */
			dir = ddd[randint0(8)];
		}

	/* Running attempts always fail */
	if (too) {
		msg("You are too confused.");
		return true;
	}

	if (*dp != dir) {
		msg("You are confused.");
		*dp = dir;
		return true;
	}
	}

	return false;
}